

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int calc_pack_bs_mt_workers
              (TileDataEnc *tile_data,int num_tiles,int avail_workers,_Bool pack_bs_mt_enabled)

{
  float fVar1;
  float local_4c;
  float this_sum;
  float setup_time_const;
  float fas_per_worker_const;
  int num_workers;
  float max_sum;
  float job_disp_time_const;
  int ideal_num_workers;
  int idx;
  uint64_t frame_abs_sum_level;
  _Bool pack_bs_mt_enabled_local;
  int avail_workers_local;
  int num_tiles_local;
  TileDataEnc *tile_data_local;
  int local_4;
  
  if (pack_bs_mt_enabled) {
    frame_abs_sum_level = 0;
    for (idx = 0; idx < num_tiles; idx = idx + 1) {
      frame_abs_sum_level = tile_data[idx].abs_sum_level + frame_abs_sum_level;
    }
    ideal_num_workers = 1;
    max_sum = 0.0;
    for (num_workers = avail_workers; 1 < num_workers; num_workers = num_workers + -1) {
      local_4c = (float)frame_abs_sum_level;
      fVar1 = (((float)(num_workers + -1) / (float)num_workers) * local_4c -
              (float)num_workers * 5.0) - ((float)num_tiles * 1.0) / (float)num_workers;
      if (max_sum < fVar1) {
        ideal_num_workers = num_workers;
        max_sum = fVar1;
      }
    }
    local_4 = ideal_num_workers;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int calc_pack_bs_mt_workers(const TileDataEnc *tile_data, int num_tiles,
                                   int avail_workers, bool pack_bs_mt_enabled) {
  if (!pack_bs_mt_enabled) return 1;

  uint64_t frame_abs_sum_level = 0;

  for (int idx = 0; idx < num_tiles; idx++)
    frame_abs_sum_level += tile_data[idx].abs_sum_level;

  int ideal_num_workers = 1;
  const float job_disp_time_const = (float)num_tiles * JOB_DISP_TIME_OH_CONST;
  float max_sum = 0.0;

  for (int num_workers = avail_workers; num_workers > 1; num_workers--) {
    const float fas_per_worker_const =
        ((float)(num_workers - 1) / num_workers) * frame_abs_sum_level;
    const float setup_time_const = (float)num_workers * SETUP_TIME_OH_CONST;
    const float this_sum = fas_per_worker_const - setup_time_const -
                           job_disp_time_const / num_workers;

    if (this_sum > max_sum) {
      max_sum = this_sum;
      ideal_num_workers = num_workers;
    }
  }
  return ideal_num_workers;
}